

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManUpdate(Fx_Man_t *p,int iDiv,int *fWarning)

{
  Vec_Wec_t *pVVar1;
  Vec_Wec_t *pVVar2;
  Fx_Man_t *pFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  int fCompl;
  float Diff;
  int Level;
  int RetValue;
  int iVarNew;
  int Lit1;
  int Lit0;
  int k;
  int i;
  Vec_Int_t *vDiv;
  Vec_Int_t *vLitN;
  Vec_Int_t *vLitP;
  Vec_Int_t *vCube2;
  Vec_Int_t *vCube;
  int *fWarning_local;
  Fx_Man_t *pFStack_10;
  int iDiv_local;
  Fx_Man_t *p_local;
  
  vLitN = (Vec_Int_t *)0x0;
  vDiv = (Vec_Int_t *)0x0;
  _k = p->vDiv;
  Level = 0;
  vCube = (Vec_Int_t *)fWarning;
  fWarning_local._4_4_ = iDiv;
  pFStack_10 = p;
  fVar11 = Vec_FltEntry(p->vWeights,iDiv);
  fVar12 = Vec_FltEntry(pFStack_10->vWeights,fWarning_local._4_4_);
  if ((fVar11 - (float)(int)fVar12 <= 0.0) || (1.0 <= fVar11 - (float)(int)fVar12)) {
    __assert_fail("Diff > 0.0 && Diff < 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x3cb,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  pFStack_10->nDivs = pFStack_10->nDivs + 1;
  Vec_IntClear(_k);
  pVVar9 = _k;
  pVVar8 = Hsh_VecReadEntry(pFStack_10->pHash,fWarning_local._4_4_);
  Vec_IntAppend(pVVar9,pVVar8);
  Fx_ManDivFindPivots(_k,&iVarNew,&RetValue);
  if ((iVarNew < 0) || (RetValue < 0)) {
    __assert_fail("Lit0 >= 0 && Lit1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x3d2,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  Vec_IntClear(pFStack_10->vCubesS);
  iVar4 = Vec_IntSize(_k);
  if (iVar4 == 2) {
    pVVar1 = pFStack_10->vCubes;
    pVVar2 = pFStack_10->vLits;
    iVar4 = Abc_LitNot(iVarNew);
    pVVar9 = Vec_WecEntry(pVVar2,iVar4);
    Fx_ManCompressCubes(pVVar1,pVVar9);
    pVVar1 = pFStack_10->vCubes;
    pVVar2 = pFStack_10->vLits;
    iVar4 = Abc_LitNot(RetValue);
    pVVar9 = Vec_WecEntry(pVVar2,iVar4);
    Fx_ManCompressCubes(pVVar1,pVVar9);
    pVVar1 = pFStack_10->vLits;
    iVar4 = Abc_LitNot(iVarNew);
    pVVar9 = Vec_WecEntry(pVVar1,iVar4);
    pVVar1 = pFStack_10->vLits;
    iVar4 = Abc_LitNot(RetValue);
    pVVar8 = Vec_WecEntry(pVVar1,iVar4);
    Vec_IntTwoRemoveCommon(pVVar9,pVVar8,pFStack_10->vCubesS);
  }
  pVVar1 = pFStack_10->vCubes;
  pVVar9 = Vec_WecEntry(pFStack_10->vLits,iVarNew);
  Fx_ManCompressCubes(pVVar1,pVVar9);
  pVVar1 = pFStack_10->vCubes;
  pVVar9 = Vec_WecEntry(pFStack_10->vLits,RetValue);
  Fx_ManCompressCubes(pVVar1,pVVar9);
  pVVar1 = pFStack_10->vCubes;
  pVVar9 = Vec_WecEntry(pFStack_10->vLits,iVarNew);
  pVVar8 = Vec_WecEntry(pFStack_10->vLits,RetValue);
  Fx_ManFindCommonPairs
            (pVVar1,pVVar9,pVVar8,pFStack_10->vCubesD,pFStack_10->vCompls,_k,pFStack_10->vCubeFree,
             &vCube->nCap);
  Lit0 = 0;
  while( true ) {
    iVar4 = Lit0;
    iVar5 = Vec_IntSize(pFStack_10->vCubesS);
    bVar10 = false;
    if (iVar4 < iVar5) {
      pVVar1 = pFStack_10->vCubes;
      iVar4 = Vec_IntEntry(pFStack_10->vCubesS,Lit0);
      vCube2 = Vec_WecEntry(pVVar1,iVar4);
      bVar10 = vCube2 != (Vec_Int_t *)0x0;
    }
    if (!bVar10) break;
    Fx_ManCubeSingleCubeDivisors(pFStack_10,vCube2,1,1);
    Lit0 = Lit0 + 1;
  }
  Lit0 = 0;
  while( true ) {
    iVar4 = Lit0;
    iVar5 = Vec_IntSize(pFStack_10->vCubesD);
    bVar10 = false;
    if (iVar4 < iVar5) {
      pVVar1 = pFStack_10->vCubes;
      iVar4 = Vec_IntEntry(pFStack_10->vCubesD,Lit0);
      vCube2 = Vec_WecEntry(pVVar1,iVar4);
      bVar10 = vCube2 != (Vec_Int_t *)0x0;
    }
    if (!bVar10) break;
    Fx_ManCubeSingleCubeDivisors(pFStack_10,vCube2,1,1);
    Lit0 = Lit0 + 1;
  }
  Vec_WecMarkLevels(pFStack_10->vCubes,pFStack_10->vCubesS);
  Vec_WecMarkLevels(pFStack_10->vCubes,pFStack_10->vCubesD);
  Lit0 = 0;
  while( true ) {
    iVar4 = Lit0;
    iVar5 = Vec_IntSize(pFStack_10->vCubesS);
    bVar10 = false;
    if (iVar4 < iVar5) {
      pVVar1 = pFStack_10->vCubes;
      iVar4 = Vec_IntEntry(pFStack_10->vCubesS,Lit0);
      vCube2 = Vec_WecEntry(pVVar1,iVar4);
      bVar10 = vCube2 != (Vec_Int_t *)0x0;
    }
    pFVar3 = pFStack_10;
    if (!bVar10) break;
    iVar4 = Fx_ManGetFirstVarCube(pFStack_10,vCube2);
    Fx_ManCubeDoubleCubeDivisors(pFVar3,iVar4,vCube2,1,1,&vCube->nCap);
    Lit0 = Lit0 + 1;
  }
  Lit0 = 0;
  while( true ) {
    iVar4 = Lit0;
    iVar5 = Vec_IntSize(pFStack_10->vCubesD);
    bVar10 = false;
    if (iVar4 < iVar5) {
      pVVar1 = pFStack_10->vCubes;
      iVar4 = Vec_IntEntry(pFStack_10->vCubesD,Lit0);
      vCube2 = Vec_WecEntry(pVVar1,iVar4);
      bVar10 = vCube2 != (Vec_Int_t *)0x0;
    }
    pFVar3 = pFStack_10;
    if (!bVar10) break;
    iVar4 = Fx_ManGetFirstVarCube(pFStack_10,vCube2);
    Fx_ManCubeDoubleCubeDivisors(pFVar3,iVar4,vCube2,1,1,&vCube->nCap);
    Lit0 = Lit0 + 1;
  }
  Vec_WecUnmarkLevels(pFStack_10->vCubes,pFStack_10->vCubesS);
  Vec_WecUnmarkLevels(pFStack_10->vCubes,pFStack_10->vCubesD);
  iVar4 = Abc_Lit2Var(iVarNew);
  iVar5 = Abc_Lit2Var(RetValue);
  if (iVar4 == iVar5) {
    pVVar9 = Hsh_VecReadEntry(pFStack_10->pHash,fWarning_local._4_4_);
    iVar4 = Vec_IntSize(pVVar9);
    if (iVar4 == 2) goto LAB_0031774c;
  }
  iVar4 = Vec_WecSize(pFStack_10->vLits);
  Level = iVar4 / 2;
  iVar4 = Vec_IntSize(pFStack_10->vVarCube);
  if (iVar4 != Level) {
    __assert_fail("Vec_IntSize(p->vVarCube) == iVarNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x3fc,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  pVVar9 = pFStack_10->vVarCube;
  iVar4 = Vec_WecSize(pFStack_10->vCubes);
  Vec_IntPush(pVVar9,iVar4);
  vCube2 = Vec_WecPushLevel(pFStack_10->vCubes);
  Vec_IntPush(vCube2,Level);
  iVar4 = Vec_IntSize(_k);
  pVVar9 = vCube2;
  if (iVar4 == 2) {
    iVar4 = Abc_LitNot(iVarNew);
    Vec_IntPush(pVVar9,iVar4);
    pVVar9 = vCube2;
    iVar4 = Abc_LitNot(RetValue);
    Vec_IntPush(pVVar9,iVar4);
    iVar4 = Fx_ManComputeLevelCube(pFStack_10,vCube2);
    fCompl = iVar4 + 1;
  }
  else {
    vLitP = Vec_WecPushLevel(pFStack_10->vCubes);
    pVVar1 = pFStack_10->vCubes;
    iVar4 = Vec_WecSize(pFStack_10->vCubes);
    vCube2 = Vec_WecEntry(pVVar1,iVar4 + -2);
    Vec_IntPush(vLitP,Level);
    Fx_ManDivAddLits(vCube2,vLitP,_k);
    iVar4 = Fx_ManComputeLevelCube(pFStack_10,vCube2);
    iVar5 = Fx_ManComputeLevelCube(pFStack_10,vLitP);
    iVar4 = Abc_MaxInt(iVar4,iVar5);
    fCompl = iVar4 + 2;
  }
  iVar4 = Vec_IntSize(pFStack_10->vLevels);
  if (iVar4 != Level) {
    __assert_fail("Vec_IntSize(p->vLevels) == iVarNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x40e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  Vec_IntPush(pFStack_10->vLevels,fCompl);
  iVar4 = Vec_IntSize(_k);
  pFStack_10->nLits = iVar4 + pFStack_10->nLits;
  vLitN = Vec_WecPushLevel(pFStack_10->vLits);
  vDiv = Vec_WecPushLevel(pFStack_10->vLits);
  pVVar1 = pFStack_10->vLits;
  iVar4 = Vec_WecSize(pFStack_10->vLits);
  vLitN = Vec_WecEntry(pVVar1,iVar4 + -2);
  Lit0 = 0;
  while( true ) {
    iVar4 = Lit0;
    iVar5 = Vec_IntSize(pFStack_10->vCubesS);
    bVar10 = false;
    if (iVar4 < iVar5) {
      pVVar1 = pFStack_10->vCubes;
      iVar4 = Vec_IntEntry(pFStack_10->vCubesS,Lit0);
      vCube2 = Vec_WecEntry(pVVar1,iVar4);
      bVar10 = vCube2 != (Vec_Int_t *)0x0;
    }
    pVVar9 = vCube2;
    if (!bVar10) break;
    iVar4 = Abc_LitNot(iVarNew);
    iVar4 = Vec_IntRemove1(pVVar9,iVar4);
    pVVar9 = vCube2;
    iVar5 = Abc_LitNot(RetValue);
    iVar5 = Vec_IntRemove1(pVVar9,iVar5);
    pVVar9 = vCube2;
    if (iVar5 + iVar4 != 2) {
      __assert_fail("RetValue == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                    ,0x41b,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    iVar4 = Abc_Var2Lit(Level,0);
    Vec_IntPush(pVVar9,iVar4);
    pVVar9 = vLitN;
    iVar4 = Vec_WecLevelId(pFStack_10->vCubes,vCube2);
    Vec_IntPush(pVVar9,iVar4);
    pFStack_10->nLits = pFStack_10->nLits + -1;
    Lit0 = Lit0 + 1;
  }
LAB_0031774c:
  Lit1 = 0;
  pFStack_10->nCompls = 0;
  iVar4 = Vec_IntSize(pFStack_10->vCubesD);
  if (iVar4 % 2 != 0) {
    __assert_fail("Vec_IntSize(p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x424,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  iVar4 = Vec_IntSize(pFStack_10->vCubesD);
  iVar5 = Vec_IntSize(pFStack_10->vCompls);
  if (iVar4 != iVar5 * 2) {
    __assert_fail("Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x425,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  Lit0 = 0;
  while( true ) {
    iVar5 = Lit0;
    iVar6 = Vec_IntSize(pFStack_10->vCubesD);
    iVar4 = Lit1;
    if (iVar6 <= iVar5) {
      iVar5 = Vec_IntSize(pFStack_10->vCubesD);
      if (iVar4 != iVar5 / 2) {
        __assert_fail("k == Vec_IntSize(p->vCubesD) / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                      ,0x442,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
      }
      Vec_IntShrink(pFStack_10->vCubesD,Lit1);
      Vec_IntSort(pFStack_10->vCubesD,0);
      Lit0 = 0;
      while( true ) {
        iVar4 = Lit0;
        iVar5 = Vec_IntSize(pFStack_10->vCubesS);
        bVar10 = false;
        if (iVar4 < iVar5) {
          pVVar1 = pFStack_10->vCubes;
          iVar4 = Vec_IntEntry(pFStack_10->vCubesS,Lit0);
          vCube2 = Vec_WecEntry(pVVar1,iVar4);
          bVar10 = vCube2 != (Vec_Int_t *)0x0;
        }
        if (!bVar10) break;
        Fx_ManCubeSingleCubeDivisors(pFStack_10,vCube2,0,1);
        Lit0 = Lit0 + 1;
      }
      Lit0 = 0;
      while( true ) {
        iVar4 = Lit0;
        iVar5 = Vec_IntSize(pFStack_10->vCubesD);
        bVar10 = false;
        if (iVar4 < iVar5) {
          pVVar1 = pFStack_10->vCubes;
          iVar4 = Vec_IntEntry(pFStack_10->vCubesD,Lit0);
          vCube2 = Vec_WecEntry(pVVar1,iVar4);
          bVar10 = vCube2 != (Vec_Int_t *)0x0;
        }
        if (!bVar10) break;
        Fx_ManCubeSingleCubeDivisors(pFStack_10,vCube2,0,1);
        Lit0 = Lit0 + 1;
      }
      Vec_WecMarkLevels(pFStack_10->vCubes,pFStack_10->vCubesS);
      Vec_WecMarkLevels(pFStack_10->vCubes,pFStack_10->vCubesD);
      Lit0 = 0;
      while( true ) {
        iVar4 = Lit0;
        iVar5 = Vec_IntSize(pFStack_10->vCubesS);
        bVar10 = false;
        if (iVar4 < iVar5) {
          pVVar1 = pFStack_10->vCubes;
          iVar4 = Vec_IntEntry(pFStack_10->vCubesS,Lit0);
          vCube2 = Vec_WecEntry(pVVar1,iVar4);
          bVar10 = vCube2 != (Vec_Int_t *)0x0;
        }
        pFVar3 = pFStack_10;
        if (!bVar10) break;
        iVar4 = Fx_ManGetFirstVarCube(pFStack_10,vCube2);
        Fx_ManCubeDoubleCubeDivisors(pFVar3,iVar4,vCube2,0,1,&vCube->nCap);
        Lit0 = Lit0 + 1;
      }
      Lit0 = 0;
      while( true ) {
        iVar4 = Lit0;
        iVar5 = Vec_IntSize(pFStack_10->vCubesD);
        bVar10 = false;
        if (iVar4 < iVar5) {
          pVVar1 = pFStack_10->vCubes;
          iVar4 = Vec_IntEntry(pFStack_10->vCubesD,Lit0);
          vCube2 = Vec_WecEntry(pVVar1,iVar4);
          bVar10 = vCube2 != (Vec_Int_t *)0x0;
        }
        pFVar3 = pFStack_10;
        if (!bVar10) break;
        iVar4 = Fx_ManGetFirstVarCube(pFStack_10,vCube2);
        Fx_ManCubeDoubleCubeDivisors(pFVar3,iVar4,vCube2,0,1,&vCube->nCap);
        Lit0 = Lit0 + 1;
      }
      Vec_WecUnmarkLevels(pFStack_10->vCubes,pFStack_10->vCubesS);
      Vec_WecUnmarkLevels(pFStack_10->vCubes,pFStack_10->vCubesD);
      iVar4 = Vec_IntSize(pFStack_10->vSCC);
      if (iVar4 != 0) {
        Vec_IntUniqify(pFStack_10->vSCC);
        Lit0 = 0;
        while( true ) {
          iVar4 = Lit0;
          iVar5 = Vec_IntSize(pFStack_10->vSCC);
          bVar10 = false;
          if (iVar4 < iVar5) {
            pVVar1 = pFStack_10->vCubes;
            iVar4 = Vec_IntEntry(pFStack_10->vSCC,Lit0);
            vCube2 = Vec_WecEntry(pVVar1,iVar4);
            bVar10 = vCube2 != (Vec_Int_t *)0x0;
          }
          pFVar3 = pFStack_10;
          if (!bVar10) break;
          iVar4 = Fx_ManGetFirstVarCube(pFStack_10,vCube2);
          Fx_ManCubeDoubleCubeDivisors(pFVar3,iVar4,vCube2,1,1,&vCube->nCap);
          Vec_IntClear(vCube2);
          Lit0 = Lit0 + 1;
        }
        Vec_IntClear(pFStack_10->vSCC);
      }
      iVar4 = Vec_IntSize(_k);
      if (2 < iVar4) {
        pVVar1 = pFStack_10->vCubes;
        iVar4 = Vec_WecSize(pFStack_10->vCubes);
        vCube2 = Vec_WecEntry(pVVar1,iVar4 + -2);
        pVVar1 = pFStack_10->vCubes;
        iVar4 = Vec_WecSize(pFStack_10->vCubes);
        vLitP = Vec_WecEntry(pVVar1,iVar4 + -1);
        Fx_ManCubeSingleCubeDivisors(pFStack_10,vCube2,0,1);
        Fx_ManCubeSingleCubeDivisors(pFStack_10,vLitP,0,1);
        for (Lit0 = 1; iVar4 = Lit0, iVar5 = Vec_IntSize(vCube2), iVar4 < iVar5; Lit0 = Lit0 + 1) {
          iVar4 = Vec_IntEntry(vCube2,Lit0);
          pVVar1 = pFStack_10->vLits;
          iVarNew = iVar4;
          iVar5 = Vec_WecLevelId(pFStack_10->vCubes,vCube2);
          Vec_WecPush(pVVar1,iVar4,iVar5);
        }
        for (Lit0 = 1; iVar4 = Lit0, iVar5 = Vec_IntSize(vLitP), iVar4 < iVar5; Lit0 = Lit0 + 1) {
          iVar4 = Vec_IntEntry(vLitP,Lit0);
          pVVar1 = pFStack_10->vLits;
          iVarNew = iVar4;
          iVar5 = Vec_WecLevelId(pFStack_10->vCubes,vLitP);
          Vec_WecPush(pVVar1,iVar4,iVar5);
        }
      }
      for (Lit0 = 0; iVar4 = Lit0, iVar5 = Vec_IntSize(_k), iVar4 < iVar5; Lit0 = Lit0 + 1) {
        iVarNew = Vec_IntEntry(_k,Lit0);
        pVVar1 = pFStack_10->vLits;
        iVar4 = Abc_Lit2Var(iVarNew);
        pVVar9 = Vec_WecEntry(pVVar1,iVar4);
        Vec_IntTwoRemove(pVVar9,pFStack_10->vCubesD);
        if (((pFStack_10->nCompls != 0) && (1 < Lit0)) || (iVar4 = Vec_IntSize(_k), iVar4 == 2)) {
          pVVar1 = pFStack_10->vLits;
          iVar4 = Abc_Lit2Var(iVarNew);
          iVar4 = Abc_LitNot(iVar4);
          pVVar9 = Vec_WecEntry(pVVar1,iVar4);
          Vec_IntTwoRemove(pVVar9,pFStack_10->vCubesD);
        }
      }
      return;
    }
    iVar4 = Vec_IntEntry(pFStack_10->vCompls,Lit0 / 2);
    pFStack_10->nCompls = iVar4 + pFStack_10->nCompls;
    pVVar1 = pFStack_10->vCubes;
    iVar5 = Vec_IntEntry(pFStack_10->vCubesD,Lit0);
    vCube2 = Vec_WecEntry(pVVar1,iVar5);
    pVVar1 = pFStack_10->vCubes;
    iVar5 = Vec_IntEntry(pFStack_10->vCubesD,Lit0 + 1);
    vLitP = Vec_WecEntry(pVVar1,iVar5);
    iVar5 = Fx_ManDivRemoveLits(vCube2,_k,iVar4);
    iVar6 = Fx_ManDivRemoveLits(vLitP,_k,iVar4);
    iVar7 = Vec_IntSize(_k);
    if ((iVar6 + iVar5 != iVar7) && (iVar7 = Vec_IntSize(_k), iVar6 + iVar5 != iVar7 + 1)) break;
    if (0 < Level) {
      iVar5 = Vec_IntSize(_k);
      pVVar9 = vCube2;
      if ((iVar5 == 2) || (iVar4 != 0)) {
        iVar4 = Abc_Var2Lit(Level,1);
        Vec_IntPush(pVVar9,iVar4);
        pVVar9 = vDiv;
        iVar4 = Vec_WecLevelId(pFStack_10->vCubes,vCube2);
        Vec_IntPush(pVVar9,iVar4);
      }
      else {
        iVar4 = Abc_Var2Lit(Level,0);
        Vec_IntPush(pVVar9,iVar4);
        pVVar9 = vLitN;
        iVar4 = Vec_WecLevelId(pFStack_10->vCubes,vCube2);
        Vec_IntPush(pVVar9,iVar4);
      }
    }
    iVar5 = Vec_IntSize(_k);
    iVar6 = Vec_IntSize(vLitP);
    iVar4 = Lit1;
    pFStack_10->nLits = pFStack_10->nLits - (iVar5 + iVar6 + -2);
    pVVar9 = pFStack_10->vCubesD;
    Lit1 = Lit1 + 1;
    iVar5 = Vec_WecLevelId(pFStack_10->vCubes,vCube2);
    Vec_IntWriteEntry(pVVar9,iVar4,iVar5);
    Vec_IntClear(vLitP);
    Lit0 = Lit0 + 2;
  }
  __assert_fail("RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                ,0x42e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
}

Assistant:

void Fx_ManUpdate( Fx_Man_t * p, int iDiv, int * fWarning )
{
    Vec_Int_t * vCube, * vCube2, * vLitP = NULL, * vLitN = NULL;
    Vec_Int_t * vDiv = p->vDiv;
    int i, k, Lit0, Lit1, iVarNew = 0, RetValue, Level;
    float Diff = Vec_FltEntry(p->vWeights, iDiv) - (float)((int)Vec_FltEntry(p->vWeights, iDiv));
    assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    p->nDivs++;
    Vec_IntClear( vDiv );
    Vec_IntAppend( vDiv, Hsh_VecReadEntry(p->pHash, iDiv) );
    Fx_ManDivFindPivots( vDiv, &Lit0, &Lit1 );
    assert( Lit0 >= 0 && Lit1 >= 0 );


    // collect single-cube-divisor cubes
    Vec_IntClear( p->vCubesS );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)) );
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)), Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)), p->vCubesS );
    }

    // collect double-cube-divisor cube pairs
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit0) );
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit1) );
    Fx_ManFindCommonPairs( p->vCubes, Vec_WecEntry(p->vLits, Lit0), Vec_WecEntry(p->vLits, Lit1), p->vCubesD, p->vCompls, vDiv, p->vCubeFree, fWarning );

    // subtract cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // subtract cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) == 2 )
        goto ExtractFromPairs;

    // create new divisor
    iVarNew = Vec_WecSize( p->vLits ) / 2;
    assert( Vec_IntSize(p->vVarCube) == iVarNew );
    Vec_IntPush( p->vVarCube, Vec_WecSize(p->vCubes) );
    vCube = Vec_WecPushLevel( p->vCubes );
    Vec_IntPush( vCube, iVarNew );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Vec_IntPush( vCube, Abc_LitNot(Lit0) );
        Vec_IntPush( vCube, Abc_LitNot(Lit1) );
        Level = 1 + Fx_ManComputeLevelCube( p, vCube );
    }
    else
    {
        vCube2 = Vec_WecPushLevel( p->vCubes );
        vCube = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        Vec_IntPush( vCube2, iVarNew );
        Fx_ManDivAddLits( vCube, vCube2, vDiv );
        Level = 2 + Abc_MaxInt( Fx_ManComputeLevelCube(p, vCube), Fx_ManComputeLevelCube(p, vCube2) );
    }
    assert( Vec_IntSize(p->vLevels) == iVarNew );
    Vec_IntPush( p->vLevels, Level );
    // do not add new cubes to the matrix 
    p->nLits += Vec_IntSize( vDiv );
    // create new literals
    vLitP = Vec_WecPushLevel( p->vLits );
    vLitN = Vec_WecPushLevel( p->vLits );
    vLitP = Vec_WecEntry( p->vLits, Vec_WecSize(p->vLits) - 2 );
    // create updated single-cube divisor cubes
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
    {
        RetValue  = Vec_IntRemove1( vCube, Abc_LitNot(Lit0) );
        RetValue += Vec_IntRemove1( vCube, Abc_LitNot(Lit1) );
        assert( RetValue == 2 );
        Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
        Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) );
        p->nLits--;
    }
    // create updated double-cube divisor cube pairs
ExtractFromPairs:
    k = 0;
    p->nCompls = 0;
    assert( Vec_IntSize(p->vCubesD) % 2 == 0 );
    assert( Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls) );
    for ( i = 0; i < Vec_IntSize(p->vCubesD); i += 2 )
    {
        int fCompl = Vec_IntEntry(p->vCompls, i/2);
        p->nCompls += fCompl;
        vCube  = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i) );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i+1) );
        RetValue  = Fx_ManDivRemoveLits( vCube, vDiv, fCompl );  // cube 2*i
        RetValue += Fx_ManDivRemoveLits( vCube2, vDiv, fCompl ); // cube 2*i+1
        assert( RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1);
        if ( iVarNew > 0 )
        {
            if ( Vec_IntSize(vDiv) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 1) );
                Vec_IntPush( vLitN, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
            else 
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
                Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
        }
        p->nLits -= Vec_IntSize(vDiv) + Vec_IntSize(vCube2) - 2;

        // remove second cube
        Vec_IntWriteEntry( p->vCubesD, k++, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntClear( vCube2 ); 
    }
    assert( k == Vec_IntSize(p->vCubesD) / 2 );
    Vec_IntShrink( p->vCubesD, k );
    Vec_IntSort( p->vCubesD, 0 );
    //Vec_IntSort( vLitN, 0 );
    //Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // add cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    // Deal with SCC
    if ( Vec_IntSize( p->vSCC ) )
    {
        Vec_IntUniqify( p->vSCC );
        Fx_ManForEachCubeVec( p->vSCC, p->vCubes, vCube, i )
        {
            Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
            Vec_IntClear( vCube );
        }
        Vec_IntClear( p->vSCC );
    }
    // add cost of the new divisor
    if ( Vec_IntSize(vDiv) > 2 )
    {
        vCube  = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 1 );
        Fx_ManCubeSingleCubeDivisors( p, vCube,  0, 1 );  // add - update
        Fx_ManCubeSingleCubeDivisors( p, vCube2, 0, 1 );  // add - update
        Vec_IntForEachEntryStart( vCube, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntForEachEntryStart( vCube2, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube2) );
    }

    // remove these cubes from the lit array of the divisor
    Vec_IntForEachEntry( vDiv, Lit0, i )
    {
        Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_Lit2Var(Lit0)), p->vCubesD );
        if ( (p->nCompls && i > 1) || Vec_IntSize( vDiv ) == 2 ) // the last two lits are possibly complemented
            Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_LitNot(Abc_Lit2Var(Lit0))), p->vCubesD );
    }

}